

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticEmitterSystem.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::~UnderwaterAcousticEmitterSystem
          (UnderwaterAcousticEmitterSystem *this)

{
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__UnderwaterAcousticEmitterSystem_002184a0;
  std::
  vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
  ::clear(&this->m_vUAEB);
  std::
  vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
  ::~vector(&this->m_vUAEB);
  DataTypeBase::~DataTypeBase(&(this->m_Location).super_DataTypeBase);
  AcousticEmitterSystem::~AcousticEmitterSystem(&this->m_AES);
  DataTypeBase::~DataTypeBase(&this->super_DataTypeBase);
  return;
}

Assistant:

UnderwaterAcousticEmitterSystem::~UnderwaterAcousticEmitterSystem()
{
    m_vUAEB.clear();
}